

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O3

void BasicTests::readNetworkTest(char *networkSourceFile)

{
  Graph *this;
  allocator local_31;
  string local_30;
  
  this = (Graph *)operator_new(0x88);
  Graph::Graph(this);
  std::__cxx11::string::string((string *)&local_30,networkSourceFile,&local_31);
  Graph::input_read(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BasicTests::readNetworkTest(char *networkSourceFile) {
    Graph *g = new Graph();
    g->input_read(networkSourceFile);
}